

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 10.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  char *pcVar2;
  int x;
  char eme [8];
  int local_1c;
  char local_18 [8];
  
  builtin_strncpy(local_18,"\x1b[1;32m",8);
  std::operator<<((ostream *)&std::cout,local_18);
  std::operator<<((ostream *)&std::cout,
                  "Summum bonum ( \'sumo bem\' ou \'bem maior, em latim) eh uma expressao latina usada na filosofia - particularmente, em Aristoteles "
                 );
  poVar1 = std::operator<<((ostream *)&std::cout,
                           ",na filosofia medieval e na filosofia de Immanuel Kant - para descrever o bem maior que o ser humano deve buscar."
                          );
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Voce se considera sujeito ao \'Summum Bonum\'(digite 1 pra sim e 0 pra nao)?"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  std::istream::operator>>((istream *)&std::cin,&local_1c);
  pcVar2 = "Nada mal. A natureza desse estado preocupou muitos autores, dentre eles cristaos.";
  if (local_1c == 1) {
    pcVar2 = "Parabens.Summum Bonum eh o maximo do bem que eh um fim em si.";
  }
  std::operator<<((ostream *)&std::cout,pcVar2);
  return 0;
}

Assistant:

int main()
{
    char eme[] = {0x1b, '[', '1', ';', '3', '2', 'm', 0};
    cout << eme;
    int x;
    cout << "Summum bonum ( 'sumo bem' ou 'bem maior, em latim) eh uma expressao latina usada na filosofia - particularmente, em Aristoteles ";
    cout << ",na filosofia medieval e na filosofia de Immanuel Kant - para descrever o bem maior que o ser humano deve buscar." << endl
         << endl;
    cout << "Voce se considera sujeito ao 'Summum Bonum'(digite 1 pra sim e 0 pra nao)?" << endl;
    cin >> x;

    if (x == true)
    {
        cout << "Parabens.Summum Bonum eh o maximo do bem que eh um fim em si.";
    }
    else
    {
        cout << "Nada mal. A natureza desse estado preocupou muitos autores, dentre eles cristaos.";
    }

    return 0;
}